

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::reverseDFS
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,int skip_n)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  uint *puVar10;
  
  uVar9 = (ulong)u;
  iVar6 = u + 0x3f;
  if (-1 < u) {
    iVar6 = u;
  }
  puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p +
           (long)(iVar6 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar3 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(uint **)((long)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
  pcVar7 = sat.assigns.data;
  for (puVar10 = *(uint **)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data; puVar10 != puVar4; puVar10 = puVar10 + 1) {
    uVar2 = *puVar10;
    pBVar5 = (this->super_GraphPropagator).es.data;
    if ((pcVar7[(uint)pBVar5[uVar2].v] == '\0') ||
       ((uint)pBVar5[uVar2].s * 2 + -1 != (int)pcVar7[(uint)pBVar5[uVar2].v])) {
      iVar6 = *(this->super_GraphPropagator).endnodes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (iVar6 != skip_n) {
        iVar8 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar8 = iVar6;
        }
        if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar8 >> 6) +
              (ulong)(((long)iVar6 & 0x800000000000003fU) < 0x8000000000000001) + 0xffffffffffffffff
             ] >> ((long)iVar6 & 0x3fU) & 1) == 0) {
          reverseDFS(this,iVar6,v,skip_n);
          pcVar7 = sat.assigns.data;
        }
      }
    }
  }
  return;
}

Assistant:

void DReachabilityPropagator::reverseDFS(int u, std::vector<bool>& v, int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse()) {
			continue;
		}
		const int o = getTail(ie);
		if (o == skip_n || v[o]) {
			continue;
		}
		reverseDFS(o, v, skip_n);
	}
}